

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O3

void __thiscall pybind11::error_already_set::~error_already_set(error_already_set *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  *(undefined ***)this = &PTR__error_already_set_001498a8;
  this_00 = (this->m_fetched_error).
            super___shared_ptr<pybind11::detail::error_fetch_and_normalize,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::exception::~exception(&this->super_exception);
  operator_delete(this,0x18);
  return;
}

Assistant:

class PYBIND11_EXPORT_EXCEPTION error_already_set : public std::exception {
public:
    /// Fetches the current Python exception (using PyErr_Fetch()), which will clear the
    /// current Python error indicator.
    error_already_set()
        : m_fetched_error{new detail::error_fetch_and_normalize("pybind11::error_already_set"),
                          m_fetched_error_deleter} {}

    /// The what() result is built lazily on demand.
    /// WARNING: This member function needs to acquire the Python GIL. This can lead to
    ///          crashes (undefined behavior) if the Python interpreter is finalizing.
    const char *what() const noexcept override;

    /// Restores the currently-held Python error (which will clear the Python error indicator first
    /// if already set).
    /// NOTE: This member function will always restore the normalized exception, which may or may
    ///       not be the original Python exception.
    /// WARNING: The GIL must be held when this member function is called!
    void restore() { m_fetched_error->restore(); }

    /// If it is impossible to raise the currently-held error, such as in a destructor, we can
    /// write it out using Python's unraisable hook (`sys.unraisablehook`). The error context
    /// should be some object whose `repr()` helps identify the location of the error. Python
    /// already knows the type and value of the error, so there is no need to repeat that.
    void discard_as_unraisable(object err_context) {
        restore();
        PyErr_WriteUnraisable(err_context.ptr());
    }
    /// An alternate version of `discard_as_unraisable()`, where a string provides information on
    /// the location of the error. For example, `__func__` could be helpful.
    /// WARNING: The GIL must be held when this member function is called!
    void discard_as_unraisable(const char *err_context) {
        discard_as_unraisable(reinterpret_steal<object>(PYBIND11_FROM_STRING(err_context)));
    }

    // Does nothing; provided for backwards compatibility.
    PYBIND11_DEPRECATED("Use of error_already_set.clear() is deprecated")
    void clear() {}

    /// Check if the currently trapped error type matches the given Python exception class (or a
    /// subclass thereof).  May also be passed a tuple to search for any exception class matches in
    /// the given tuple.
    bool matches(handle exc) const { return m_fetched_error->matches(exc); }

    const object &type() const { return m_fetched_error->m_type; }
    const object &value() const { return m_fetched_error->m_value; }
    const object &trace() const { return m_fetched_error->m_trace; }

private:
    std::shared_ptr<detail::error_fetch_and_normalize> m_fetched_error;

    /// WARNING: This custom deleter needs to acquire the Python GIL. This can lead to
    ///          crashes (undefined behavior) if the Python interpreter is finalizing.
    static void m_fetched_error_deleter(detail::error_fetch_and_normalize *raw_ptr);
}